

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

Prefix * duckdb::Prefix::NewInternal
                   (Prefix *__return_storage_ptr__,ART *art,Node *node,data_ptr_t data,uint8_t count
                   ,idx_t offset,NType type)

{
  FixedSizeAllocator *this;
  IndexPointer IVar1;
  Node ptr_p;
  
  this = Node::GetAllocator(art,type);
  IVar1 = FixedSizeAllocator::New(this);
  ptr_p.super_IndexPointer.data =
       (IndexPointer)((ulong)type << 0x38 | IVar1.data & 0xffffffffffffff);
  (node->super_IndexPointer).data = (idx_t)ptr_p;
  Prefix(__return_storage_ptr__,art,ptr_p,true,false);
  __return_storage_ptr__->data[art->prefix_count] = count;
  if (data != (data_ptr_t)0x0) {
    switchD_016b0717::default(__return_storage_ptr__->data,data + offset,(ulong)count);
  }
  return __return_storage_ptr__;
}

Assistant:

Prefix Prefix::NewInternal(ART &art, Node &node, const data_ptr_t data, const uint8_t count, const idx_t offset,
                           const NType type) {
	node = Node::GetAllocator(art, type).New();
	node.SetMetadata(static_cast<uint8_t>(type));

	Prefix prefix(art, node, true);
	prefix.data[Count(art)] = count;
	if (data) {
		D_ASSERT(count);
		memcpy(prefix.data, data + offset, count);
	}
	return prefix;
}